

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O0

SUNMatrix SUNBandMatrixStorage
                    (sunindextype N,sunindextype mu,sunindextype ml,sunindextype smu,
                    SUNContext sunctx)

{
  int iVar1;
  int *piVar2;
  void *pvVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  sunindextype colSize;
  sunindextype j;
  SUNMatrixContent_Band content;
  SUNMatrix A;
  int local_34;
  SUNMatrix local_8;
  
  if (((in_EDI < 1) || (in_ECX < 0)) || (in_EDX < 0)) {
    local_8 = (SUNMatrix)0x0;
  }
  else {
    local_8 = SUNMatNewEmpty((SUNContext)0x0);
    if (local_8 == (SUNMatrix)0x0) {
      local_8 = (SUNMatrix)0x0;
    }
    else {
      local_8->ops->getid = SUNMatGetID_Band;
      local_8->ops->clone = SUNMatClone_Band;
      local_8->ops->destroy = SUNMatDestroy_Band;
      local_8->ops->zero = SUNMatZero_Band;
      local_8->ops->copy = SUNMatCopy_Band;
      local_8->ops->scaleadd = SUNMatScaleAdd_Band;
      local_8->ops->scaleaddi = SUNMatScaleAddI_Band;
      local_8->ops->matvec = SUNMatMatvec_Band;
      local_8->ops->space = SUNMatSpace_Band;
      piVar2 = (int *)malloc(0x30);
      if (piVar2 == (int *)0x0) {
        SUNMatDestroy((SUNMatrix)0x1170857);
        local_8 = (SUNMatrix)0x0;
      }
      else {
        local_8->content = piVar2;
        iVar1 = in_ECX + in_EDX + 1;
        *piVar2 = in_EDI;
        piVar2[1] = in_EDI;
        piVar2[3] = in_ESI;
        piVar2[4] = in_EDX;
        piVar2[5] = in_ECX;
        piVar2[2] = iVar1;
        piVar2[8] = in_EDI * iVar1;
        piVar2[6] = 0;
        piVar2[7] = 0;
        piVar2[10] = 0;
        piVar2[0xb] = 0;
        pvVar3 = calloc((long)(in_EDI * iVar1),8);
        *(void **)(piVar2 + 6) = pvVar3;
        if (*(long *)(piVar2 + 6) == 0) {
          SUNMatDestroy((SUNMatrix)0x1170927);
          local_8 = (SUNMatrix)0x0;
        }
        else {
          pvVar3 = malloc((long)in_EDI << 3);
          *(void **)(piVar2 + 10) = pvVar3;
          if (*(long *)(piVar2 + 10) == 0) {
            SUNMatDestroy((SUNMatrix)0x1170965);
            local_8 = (SUNMatrix)0x0;
          }
          else {
            for (local_34 = 0; local_34 < in_EDI; local_34 = local_34 + 1) {
              *(long *)(*(long *)(piVar2 + 10) + (long)local_34 * 8) =
                   *(long *)(piVar2 + 6) + (long)(local_34 * iVar1) * 8;
            }
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

SUNMatrix SUNBandMatrixStorage(sunindextype N, sunindextype mu,
                               sunindextype ml, sunindextype smu,
                               SUNContext sunctx)
{
  SUNMatrix A;
  SUNMatrixContent_Band content;
  sunindextype j, colSize;

  /* return with NULL matrix on illegal dimension input */
  if ( (N <= 0) || (smu < 0) || (ml < 0) ) return(NULL);

  /* Create an empty matrix object */
  A = NULL;
  A = SUNMatNewEmpty(sunctx);
  if (A == NULL) return(NULL);

  /* Attach operations */
  A->ops->getid     = SUNMatGetID_Band;
  A->ops->clone     = SUNMatClone_Band;
  A->ops->destroy   = SUNMatDestroy_Band;
  A->ops->zero      = SUNMatZero_Band;
  A->ops->copy      = SUNMatCopy_Band;
  A->ops->scaleadd  = SUNMatScaleAdd_Band;
  A->ops->scaleaddi = SUNMatScaleAddI_Band;
  A->ops->matvec    = SUNMatMatvec_Band;
  A->ops->space     = SUNMatSpace_Band;

  /* Create content */
  content = NULL;
  content = (SUNMatrixContent_Band) malloc(sizeof *content);
  if (content == NULL) { SUNMatDestroy(A); return(NULL); }

  /* Attach content */
  A->content = content;

  /* Fill content */
  colSize        = smu + ml + 1;
  content->M     = N;
  content->N     = N;
  content->mu    = mu;
  content->ml    = ml;
  content->s_mu  = smu;
  content->ldim  = colSize;
  content->ldata = N * colSize;
  content->data  = NULL;
  content->cols  = NULL;

  /* Allocate content */
  content->data = (realtype *) calloc(N * colSize, sizeof(realtype));
  if (content->data == NULL) { SUNMatDestroy(A); return(NULL); }

  content->cols = (realtype **) malloc(N * sizeof(realtype *));
  if (content->cols == NULL) { SUNMatDestroy(A); return(NULL); }
  for (j=0; j<N; j++) content->cols[j] = content->data + j * colSize;

  return(A);
}